

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O1

bool __thiscall I2cAnalyzer::GetBit(I2cAnalyzer *this,BitState *bit_state,U64 *sck_rising_edge)

{
  AnalyzerChannelData *pAVar1;
  char cVar2;
  BitState BVar3;
  U64 UVar4;
  bool bVar5;
  
  AnalyzerChannelData::AdvanceToNextEdge();
  UVar4 = AnalyzerChannelData::GetSampleNumber();
  *sck_rising_edge = UVar4;
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mSda);
  BVar3 = AnalyzerChannelData::GetBitState();
  *bit_state = BVar3;
  cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  bVar5 = true;
  if (cVar2 == '\0') {
    bVar5 = true;
    do {
      cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
      if (cVar2 != '\0') {
        AnalyzerChannelData::GetSampleOfNextEdge();
        cVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                          ((ulonglong)this->mScl);
        if (cVar2 != '\0') break;
        AnalyzerChannelData::AdvanceToNextEdge();
        RecordStartStopBit(this);
        bVar5 = false;
      }
      cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    } while (cVar2 == '\0');
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  pAVar1 = this->mSda;
  AnalyzerChannelData::GetSampleNumber();
  cVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
  if (cVar2 != '\0') {
    do {
      AnalyzerChannelData::AdvanceToNextEdge();
      RecordStartStopBit(this);
      pAVar1 = this->mSda;
      AnalyzerChannelData::GetSampleNumber();
      cVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
    } while (cVar2 != '\0');
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool I2cAnalyzer::GetBit( BitState& bit_state, U64& sck_rising_edge )
{
    // SCL must be low coming into this function
    mScl->AdvanceToNextEdge(); // posedge
    sck_rising_edge = mScl->GetSampleNumber();
    mSda->AdvanceToAbsPosition( sck_rising_edge ); // data read on SCL posedge

    bit_state = mSda->GetBitState();
    bool result = true;

    // this while loop is only important if you need to be careful and check for things that that might happen at the very end of a data
    // set, and you don't want to get stuck waithing on a channel that never changes.
    while( mScl->DoMoreTransitionsExistInCurrentData() == false )
    {
        // there are no more SCL transtitions, at least yet.
        if( mSda->DoMoreTransitionsExistInCurrentData() == true )
        {
            // there ARE some SDA transtions, let's double check to make sure there's still no SDA activity
            auto next_data_edge = mSda->GetSampleOfNextEdge();
            if( mScl->WouldAdvancingToAbsPositionCauseTransition( next_data_edge - 1 ) )
            {
                break;
            }

            // ok, for sure we can advance to the next SDA edge without running past any SCL events.
            mSda->AdvanceToNextEdge();

            RecordStartStopBit();
            result = false;
        }
    }

    mScl->AdvanceToNextEdge(); // negedge; we'll leave the clock here
    while( mSda->WouldAdvancingToAbsPositionCauseTransition( mScl->GetSampleNumber() - 1 ) == true )
    {
        // clock is high -- SDA changes indicate start, stop, etc.
        mSda->AdvanceToNextEdge();
        RecordStartStopBit();
        result = false;
    }

    return result;
}